

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O0

ZyanStatus
ZydisFormatterATTPrintDISP
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZyanStatus status_047620348;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x180,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context == (ZydisFormatterContext *)0x0) {
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                    ,0x182,
                    "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                   );
    }
    if ((buffer->is_token_list == '\0') ||
       (formatter_local._4_4_ = ZydisFormatterBufferAppend(buffer,'\n'),
       (formatter_local._4_4_ & 0x80000000) == 0)) {
      if (formatter->disp_signedness < ZYDIS_SIGNEDNESS_MAX_VALUE) {
        if (formatter->disp_base == ZYDIS_NUMERIC_BASE_DEC) {
          formatter_local._4_4_ =
               ZydisStringAppendDecS
                         (&buffer->string,(context->operand->field_10).mem.disp.value,
                          (ZyanU8)formatter->disp_padding,'\0',
                          formatter->number_format[formatter->disp_base][0].string,
                          formatter->number_format[formatter->disp_base][1].string);
        }
        else {
          if (formatter->disp_base != ZYDIS_NUMERIC_BASE_HEX) {
            return 0x80100004;
          }
          formatter_local._4_4_ =
               ZydisStringAppendHexS
                         (&buffer->string,(context->operand->field_10).mem.disp.value,
                          (ZyanU8)formatter->disp_padding,formatter->hex_force_leading_number,
                          formatter->hex_uppercase,'\0',
                          formatter->number_format[formatter->disp_base][0].string,
                          formatter->number_format[formatter->disp_base][1].string);
        }
      }
      else {
        if (formatter->disp_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
          return 0x80100004;
        }
        if (formatter->disp_base == ZYDIS_NUMERIC_BASE_DEC) {
          formatter_local._4_4_ =
               ZydisStringAppendDecU
                         (&buffer->string,(context->operand->field_10).mem.disp.value,
                          (ZyanU8)formatter->disp_padding,
                          formatter->number_format[formatter->disp_base][0].string,
                          formatter->number_format[formatter->disp_base][1].string);
        }
        else {
          if (formatter->disp_base != ZYDIS_NUMERIC_BASE_HEX) {
            return 0x80100004;
          }
          formatter_local._4_4_ =
               ZydisStringAppendHexU
                         (&buffer->string,(context->operand->field_10).mem.disp.value,
                          (ZyanU8)formatter->disp_padding,formatter->hex_force_leading_number,
                          formatter->hex_uppercase,
                          formatter->number_format[formatter->disp_base][0].string,
                          formatter->number_format[formatter->disp_base][1].string);
        }
      }
      if ((formatter_local._4_4_ & 0x80000000) == 0) {
        formatter_local._4_4_ = 0x100000;
      }
    }
    return formatter_local._4_4_;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                ,0x181,
                "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
    switch (formatter->disp_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        ZYDIS_STRING_APPEND_NUM_S(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding, 
            formatter->hex_force_leading_number, ZYAN_FALSE);
        break;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding, 
            formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}